

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O1

void __thiscall FModelVertexBuffer::~FModelVertexBuffer(FModelVertexBuffer *this)

{
  (this->super_FVertexBuffer)._vptr_FVertexBuffer = (_func_int **)&PTR__FModelVertexBuffer_008447d0;
  if (this->ibo_id != 0) {
    (*_ptrc_glDeleteBuffers)(1,&this->ibo_id);
  }
  if (this->vbo_ptr != (FModelVertex *)0x0) {
    operator_delete__(this->vbo_ptr);
  }
  FVertexBuffer::~FVertexBuffer(&this->super_FVertexBuffer);
  return;
}

Assistant:

FModelVertexBuffer::~FModelVertexBuffer()
{
	if (ibo_id != 0)
	{
		glDeleteBuffers(1, &ibo_id);
	}
	if (vbo_ptr != nullptr)
	{
		delete[] vbo_ptr;
	}
}